

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O2

void calc_tv(timeval *tv,timeval *read_tv,timeval *date_tv,char timestamps,int dplace)

{
  __time_t _Var1;
  long lVar2;
  int iVar3;
  undefined7 in_register_00000009;
  long lVar4;
  long lStack_8;
  
  iVar3 = (int)CONCAT71(in_register_00000009,timestamps);
  if (iVar3 == 4) {
    lStack_8 = 100;
LAB_001026fe:
    read_tv->tv_usec = lStack_8 * read_tv->tv_usec;
  }
  else if (iVar3 == 5) {
    lStack_8 = 10;
    goto LAB_001026fe;
  }
  _Var1 = main::date_tv.tv_sec;
  if ((char)date_tv == 'a') {
    lVar2 = read_tv->tv_sec + main::date_tv.tv_sec;
    tv->tv_sec = lVar2;
    lVar4 = read_tv->tv_usec + main::date_tv.tv_usec;
    goto LAB_00102759;
  }
  lVar4 = tv->tv_usec;
  lVar2 = tv->tv_sec;
  if (tv->tv_sec == 0) {
    if (lVar4 == 0) {
      if (main::date_tv.tv_usec != 0 || main::date_tv.tv_sec != 0) {
        tv->tv_sec = main::date_tv.tv_sec;
        lVar4 = main::date_tv.tv_usec;
        tv->tv_usec = main::date_tv.tv_usec;
        lVar2 = _Var1;
        goto LAB_0010274f;
      }
      lVar4 = 0;
    }
    lVar2 = 0;
  }
LAB_0010274f:
  lVar2 = lVar2 + read_tv->tv_sec;
  tv->tv_sec = lVar2;
  lVar4 = lVar4 + read_tv->tv_usec;
LAB_00102759:
  tv->tv_usec = lVar4;
  if (999999 < lVar4) {
    tv->tv_usec = lVar4 + -1000000;
    tv->tv_sec = lVar2 + 1;
  }
  return;
}

Assistant:

static void calc_tv(struct timeval *tv, struct timeval *read_tv,
		    struct timeval *date_tv, char timestamps, int dplace)
{
	if (dplace == 4) /* shift values having only 4 decimal places */
		read_tv->tv_usec *= 100;                /* and need for 6 */

	if (dplace == 5) /* shift values having only 5 decimal places */
		read_tv->tv_usec *= 10;                /* and need for 6 */

	if (timestamps == 'a') { /* absolute */

		tv->tv_sec  = date_tv->tv_sec  + read_tv->tv_sec;
		tv->tv_usec = date_tv->tv_usec + read_tv->tv_usec;

	} else { /* relative */

		if (((!tv->tv_sec) && (!tv->tv_usec)) && 
		    (date_tv->tv_sec || date_tv->tv_usec)) {
			tv->tv_sec  = date_tv->tv_sec; /* initial date/time */
			tv->tv_usec = date_tv->tv_usec;
		}

		tv->tv_sec  += read_tv->tv_sec;
		tv->tv_usec += read_tv->tv_usec;
	}

	if (tv->tv_usec >= 1000000) {
		tv->tv_usec -= 1000000;
		tv->tv_sec++;
	}
}